

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageLoadStoreTests.cpp
# Opt level: O2

TestCaseGroup * vkt::image::createImageFormatReinterpretTests(TestContext *testCtx)

{
  VkFormat format;
  VkFormat format_00;
  int iVar1;
  int iVar2;
  TestCaseGroup *pTVar3;
  LoadStoreTest *this;
  ImageType imageType;
  VkFormat format_01;
  undefined8 extraout_RDX;
  undefined8 uVar4;
  undefined8 extraout_RDX_00;
  long lVar5;
  long lVar6;
  long lVar7;
  long local_e8;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> groupByImageViewType;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  string caseName;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> testGroup;
  string local_70;
  string local_50;
  
  pTVar3 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            (pTVar3,testCtx,"format_reinterpret","Cases with differing texture and image formats");
  lVar6 = 0;
  testGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr
       = pTVar3;
  do {
    pTVar3 = testGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
             .m_data.ptr;
    if (lVar6 == 8) {
      testGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data
      .ptr = (TestCaseGroup *)0x0;
      de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
      ~UniqueBase(&testGroup.
                   super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
      return pTVar3;
    }
    pTVar3 = (TestCaseGroup *)operator_new(0x70);
    getImageTypeName_abi_cxx11_
              (&caseName,
               (image *)(ulong)*(uint *)((anonymous_namespace)::s_textures + lVar6 * 0x18 + 0xc),
               imageType);
    tcu::TestCaseGroup::TestCaseGroup(pTVar3,testCtx,caseName._M_dataplus._M_p,"");
    groupByImageViewType.
    super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr =
         pTVar3;
    std::__cxx11::string::~string((string *)&caseName);
    local_e8 = 0;
    uVar4 = extraout_RDX;
    for (lVar5 = 0;
        pTVar3 = groupByImageViewType.
                 super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                 m_data.ptr, lVar5 != 0xd; lVar5 = lVar5 + 1) {
      format = (&(anonymous_namespace)::s_formats)[lVar5];
      lVar7 = 0;
      while( true ) {
        if (lVar7 == 0x34) break;
        getFormatShortString_abi_cxx11_(&local_70,(image *)(ulong)format,(VkFormat)uVar4);
        std::operator+(&local_c0,&local_70,"_");
        format_00 = *(VkFormat *)((long)&(anonymous_namespace)::s_formats + lVar7);
        getFormatShortString_abi_cxx11_(&local_50,(image *)(ulong)format_00,format_01);
        std::operator+(&caseName,&local_c0,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_c0);
        std::__cxx11::string::~string((string *)&local_70);
        if (local_e8 != lVar7) {
          if (format != format_00) {
            local_c0._M_dataplus._M_p = (pointer)::vk::mapVkFormat(format);
            iVar1 = tcu::TextureFormat::getPixelSize((TextureFormat *)&local_c0);
            local_70._M_dataplus._M_p = (pointer)::vk::mapVkFormat(format_00);
            iVar2 = tcu::TextureFormat::getPixelSize((TextureFormat *)&local_70);
            if (iVar1 != iVar2) goto LAB_006b535e;
          }
          pTVar3 = groupByImageViewType.
                   super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                   m_data.ptr;
          this = (LoadStoreTest *)operator_new(0x98);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_c0,"",(allocator<char> *)&local_70);
          anon_unknown_0::LoadStoreTest::LoadStoreTest
                    (this,testCtx,&caseName,&local_c0,
                     (Texture *)((anonymous_namespace)::s_textures + lVar6 * 0x18),format_00,format,
                     4);
          tcu::TestNode::addChild(&pTVar3->super_TestNode,(TestNode *)this);
          std::__cxx11::string::~string((string *)&local_c0);
        }
LAB_006b535e:
        std::__cxx11::string::~string((string *)&caseName);
        lVar7 = lVar7 + 4;
        uVar4 = extraout_RDX_00;
      }
      local_e8 = local_e8 + 4;
    }
    groupByImageViewType.
    super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr =
         (TestCaseGroup *)0x0;
    tcu::TestNode::addChild
              (&(testGroup.
                 super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                 m_data.ptr)->super_TestNode,&pTVar3->super_TestNode);
    de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
    ~UniqueBase(&groupByImageViewType.
                 super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
    lVar6 = lVar6 + 1;
  } while( true );
}

Assistant:

tcu::TestCaseGroup* createImageFormatReinterpretTests (tcu::TestContext& testCtx)
{
	de::MovePtr<tcu::TestCaseGroup> testGroup(new tcu::TestCaseGroup(testCtx, "format_reinterpret",	"Cases with differing texture and image formats"));

	for (int textureNdx = 0; textureNdx < DE_LENGTH_OF_ARRAY(s_textures); ++textureNdx)
	{
		const Texture& texture = s_textures[textureNdx];
		de::MovePtr<tcu::TestCaseGroup> groupByImageViewType (new tcu::TestCaseGroup(testCtx, getImageTypeName(texture.type()).c_str(), ""));

		for (int imageFormatNdx = 0; imageFormatNdx < DE_LENGTH_OF_ARRAY(s_formats); ++imageFormatNdx)
		for (int formatNdx = 0; formatNdx < DE_LENGTH_OF_ARRAY(s_formats); ++formatNdx)
		{
			const std::string caseName = getFormatShortString(s_formats[imageFormatNdx]) + "_" + getFormatShortString(s_formats[formatNdx]);
			if (imageFormatNdx != formatNdx && formatsAreCompatible(s_formats[imageFormatNdx], s_formats[formatNdx]))
				groupByImageViewType->addChild(new LoadStoreTest(testCtx, caseName, "", texture, s_formats[formatNdx], s_formats[imageFormatNdx]));
		}
		testGroup->addChild(groupByImageViewType.release());
	}

	return testGroup.release();
}